

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rga.cpp
# Opt level: O0

MPP_RET rga_deinit(RgaCtx ctx)

{
  RgaCtxImpl *impl;
  MPP_RET ret;
  RgaCtx ctx_local;
  
  impl._4_4_ = MPP_OK;
  if ((rga_debug & 1) != 0) {
    _mpp_log_l(4,0,"in\n","rga_deinit");
  }
  if (ctx == (RgaCtx)0x0) {
    _mpp_log_l(2,0,"invalid input","rga_deinit");
    impl._4_4_ = MPP_ERR_NULL_PTR;
  }
  else {
    if (-1 < *ctx) {
      close(*ctx);
      *(undefined4 *)ctx = 0xffffffff;
    }
    mpp_osal_free("rga_deinit",ctx);
  }
  if ((rga_debug & 1) != 0) {
    _mpp_log_l(4,0,"out\n","rga_deinit");
  }
  return impl._4_4_;
}

Assistant:

MPP_RET rga_deinit(RgaCtx ctx)
{
    MPP_RET ret = MPP_OK;
    RgaCtxImpl *impl = NULL;

    rga_dbg_func("in\n");

    impl = (RgaCtxImpl *)ctx;
    if (!impl) {
        mpp_err_f("invalid input");
        ret = MPP_ERR_NULL_PTR;
        goto END;
    }

    if (impl->rga_fd >= 0) {
        close(impl->rga_fd);
        impl->rga_fd = -1;
    }

    mpp_free(impl);
END:
    rga_dbg_func("out\n");
    return ret;
}